

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlinePass::InlineEntryBlock
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block,
          DebugInlinedAtContext *inlined_at_ctx)

{
  BasicBlock *new_blk_ptr_00;
  IRContext *this_00;
  bool bVar1;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar2;
  uint32_t dbg_inlined_at;
  Instruction *this_01;
  bool bVar3;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr;
  iterator callee_inst_itr;
  Instruction *local_38;
  
  callee_first_block_itr.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       inlined_at_ctx;
  callee_first_block_itr.container_ = (UptrVector *)new_blk_ptr;
  AddStoresForVariableInitializers
            ((InlinePass *)&stack0xffffffffffffffc8,
             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)this,(DebugInlinedAtContext *)callee2caller,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)inlined_at_ctx,callee_first_block_itr);
  this_01 = local_38;
  do {
    bVar3 = this_01 ==
            (Instruction *)
            ((long)&((((callee_first_block.iterator_._M_current._M_current)->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                    insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
    if (bVar3) {
      return bVar3;
    }
    NVar2 = Instruction::GetShader100DebugOpcode(this_01);
    if (NVar2 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      new_blk_ptr_00 =
           (new_blk_ptr->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      this_00 = (this->super_Pass).context_;
      if ((this_00->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
        IRContext::BuildDebugInfoManager(this_00);
      }
      dbg_inlined_at =
           analysis::DebugInfoManager::BuildDebugInlinedAtChain
                     ((this_00->debug_info_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                      _M_head_impl,(this_01->dbg_scope_).inlined_at_,inlined_at_ctx);
      bVar1 = InlineSingleInstruction(this,callee2caller,new_blk_ptr_00,this_01,dbg_inlined_at);
      if (!bVar1) {
        return bVar3;
      }
    }
    this_01 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

bool InlinePass::InlineEntryBlock(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block,
    analysis::DebugInlinedAtContext* inlined_at_ctx) {
  auto callee_inst_itr = AddStoresForVariableInitializers(
      callee2caller, inlined_at_ctx, new_blk_ptr, callee_first_block);

  while (callee_inst_itr != callee_first_block->end()) {
    // Don't inline function definition links, the calling function is not a
    // definition.
    if (callee_inst_itr->GetShader100DebugOpcode() ==
        NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      ++callee_inst_itr;
      continue;
    }

    if (!InlineSingleInstruction(
            callee2caller, new_blk_ptr->get(), &*callee_inst_itr,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                callee_inst_itr->GetDebugScope().GetInlinedAt(),
                inlined_at_ctx))) {
      return false;
    }
    ++callee_inst_itr;
  }
  return true;
}